

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTableUnittest.cpp
# Opt level: O3

void __thiscall
OffsetTableUnittest_Savepoint_Test::~OffsetTableUnittest_Savepoint_Test
          (OffsetTableUnittest_Savepoint_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(OffsetTableUnittest, Savepoint)
{
    Savepoint sp;
    sp.Init("FastWavesUnittest.Divergence-in");
    sp.AddMetainfo("LargeTimeStep", 1);
    sp.AddMetainfo("RKStageNumber", 2);
    sp.AddMetainfo("ldyn_bbc", false);
    sp.AddMetainfo("hd", .5);

    JSONNode node = sp.ToJSON();

    Savepoint sp2;
    sp2.FromJSON(node);
    ASSERT_EQ(sp, sp2);

    sp2.AddMetainfo("Other", 42);
    ASSERT_NE(sp, sp2);

    Savepoint sp3;
    sp3.Init("FastWavesUnittest.Divergence-in");
    sp3.AddMetainfo("LargeTimeStep", 1);
    sp3.AddMetainfo("RKStageNumber", 3);
    sp3.AddMetainfo("ldyn_bbc", false);
    sp3.AddMetainfo("hd", .5);
    ASSERT_NE(sp, sp3);

    Savepoint sp4;
    sp4.Init("Test");
    sp4.AddMetainfo("Step", 5);

    Savepoint sp5;
    sp5.Init("Test");
    sp5.AddMetainfo("Step", 6);

    ASSERT_NE(sp4, sp5);
}